

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_check_zero_block(aec_stream *strm)

{
  ulong uVar1;
  int iVar2;
  internal_state *piVar3;
  long lVar4;
  ulong uVar5;
  code *pcVar6;
  ulong uVar7;
  bool bVar8;
  
  piVar3 = strm->state;
  uVar5 = (ulong)strm->block_size;
  bVar8 = uVar5 != 0;
  if (bVar8) {
    if (*piVar3->block == 0) {
      uVar7 = 0;
      do {
        if (uVar5 - 1 == uVar7) goto LAB_00102a17;
        uVar1 = uVar7 + 1;
        lVar4 = uVar7 + 1;
        uVar7 = uVar1;
      } while (piVar3->block[lVar4] == 0);
      bVar8 = uVar1 < uVar5;
    }
    if (bVar8) {
      if (piVar3->zero_blocks == 0) {
        pcVar6 = m_select_code_option;
      }
      else {
        piVar3->block_nonzero = 1;
        pcVar6 = m_encode_zero;
      }
      goto LAB_00102a6c;
    }
  }
LAB_00102a17:
  iVar2 = piVar3->zero_blocks;
  piVar3->zero_blocks = iVar2 + 1;
  if (iVar2 == 0) {
    piVar3->zero_ref = piVar3->ref;
    piVar3->zero_ref_sample = piVar3->ref_sample;
  }
  if ((piVar3->blocks_avail == 0) || ((piVar3->blocks_dispensed & 0x3f) == 0)) {
    pcVar6 = m_encode_zero;
    if (3 < iVar2) {
      piVar3->zero_blocks = -1;
    }
  }
  else {
    pcVar6 = m_get_block;
  }
LAB_00102a6c:
  piVar3->mode = pcVar6;
  return (int)piVar3;
}

Assistant:

static int m_check_zero_block(struct aec_stream *strm)
{
    /**
       Check if input block is all zero.

       Aggregate consecutive zero blocks until we find !0 or reach the
       end of a segment or RSI.
    */

    struct internal_state *state = strm->state;
    uint32_t *p = state->block;

    size_t i;
    for (i = 0; i < strm->block_size; i++)
        if (p[i] != 0)
            break;

    if (i < strm->block_size) {
        if (state->zero_blocks) {
            /* The current block isn't zero but we have to emit a
             * previous zero block first. The current block will be
             * flagged and handled later.
             */
            state->block_nonzero = 1;
            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_select_code_option;
        return M_CONTINUE;
    } else {
        state->zero_blocks++;
        if (state->zero_blocks == 1) {
            state->zero_ref = state->ref;
            state->zero_ref_sample = state->ref_sample;
        }
        if (state->blocks_avail == 0 || state->blocks_dispensed % 64 == 0) {
            if (state->zero_blocks > 4)
                state->zero_blocks = ROS;

            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}